

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::MemoryType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
          *values,MemoryType *out,char *desc)

{
  pointer pMVar1;
  pointer pMVar2;
  Result RVar3;
  char *pcVar4;
  int __c;
  Var *__s;
  uint64_t local_98;
  uint64_t uStack_90;
  undefined8 local_88;
  Var local_78;
  
  Var::Var(&local_78,var);
  __s = &local_78;
  RVar3 = CheckIndex(this,&local_78,
                     (Index)(((long)(values->
                                    super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(values->
                                   super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
                                   )._M_impl.super__Vector_impl_data._M_start) / 0x18),desc);
  Var::~Var(&local_78);
  if (out != (MemoryType *)0x0) {
    if (RVar3.enum_ == Ok) {
      pcVar4 = Var::index(var,(char *)__s,__c);
      pMVar2 = (values->
               super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar1 = pMVar2 + ((ulong)pcVar4 & 0xffffffff);
      local_98 = (pMVar1->limits).initial;
      uStack_90 = (pMVar1->limits).max;
      pMVar2 = pMVar2 + ((ulong)pcVar4 & 0xffffffff);
      local_88._0_1_ = (pMVar2->limits).has_max;
      local_88._1_1_ = (pMVar2->limits).is_shared;
      local_88._2_1_ = (pMVar2->limits).is_64;
      local_88._3_5_ = *(undefined5 *)&(pMVar2->limits).field_0x13;
    }
    else {
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
    }
    (out->limits).has_max = (bool)(undefined1)local_88;
    (out->limits).is_shared = (bool)local_88._1_1_;
    (out->limits).is_64 = (bool)local_88._2_1_;
    *(undefined5 *)&(out->limits).field_0x13 = local_88._3_5_;
    (out->limits).initial = local_98;
    (out->limits).max = uStack_90;
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}